

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O0

void run_recovery_tests(void)

{
  int i;
  undefined4 local_4;
  
  for (local_4 = 0; local_4 < COUNT; local_4 = local_4 + 1) {
    test_ecdsa_recovery_api();
  }
  for (local_4 = 0; local_4 < COUNT * 0x40; local_4 = local_4 + 1) {
    test_ecdsa_recovery_end_to_end();
  }
  test_ecdsa_recovery_edge_cases();
  return;
}

Assistant:

static void run_recovery_tests(void) {
    int i;
    for (i = 0; i < COUNT; i++) {
        test_ecdsa_recovery_api();
    }
    for (i = 0; i < 64*COUNT; i++) {
        test_ecdsa_recovery_end_to_end();
    }
    test_ecdsa_recovery_edge_cases();
}